

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abort.cpp
# Opt level: O2

void node::AbortNode(SignalInterrupt *shutdown,atomic<int> *exit_status,bilingual_str *message,
                    Warnings *warnings)

{
  bilingual_str lhs;
  bilingual_str message_00;
  bool bVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Alloc_hider in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10 [56];
  undefined1 auVar2 [32];
  undefined8 in_stack_ffffffffffffff48;
  bilingual_str local_b0;
  bilingual_str local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (warnings != (Warnings *)0x0) {
    bilingual_str::bilingual_str(&local_70,message);
    message_00.translated.field_2._8_8_ = in_stack_ffffffffffffff48;
    message_00._0_56_ = in_stack_ffffffffffffff10;
    Warnings::Set(warnings,(warning_type)in_stack_ffffffffffffff08._M_p,message_00);
    bilingual_str::~bilingual_str(&local_70);
  }
  _((bilingual_str *)&stack0xffffffffffffff10,(ConstevalStringLiteral)0x6cfae8);
  auVar2 = in_stack_ffffffffffffff10._24_32_;
  lhs.original._M_string_length = in_stack_ffffffffffffff10._0_8_;
  lhs.original.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff10._8_16_;
  lhs.translated._M_dataplus._M_p = (pointer)auVar2._0_8_;
  lhs.translated._M_string_length = auVar2._8_8_;
  lhs.translated.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar2._16_16_;
  lhs.original._M_dataplus._M_p = in_stack_ffffffffffffff08._M_p;
  ::operator+(&local_b0,lhs,(bilingual_str *)&stack0xffffffffffffff10);
  InitError(&local_b0);
  bilingual_str::~bilingual_str(&local_b0);
  bilingual_str::~bilingual_str((bilingual_str *)&stack0xffffffffffffff10);
  LOCK();
  (exit_status->super___atomic_base<int>)._M_i = 1;
  UNLOCK();
  if (shutdown != (SignalInterrupt *)0x0) {
    bVar1 = util::SignalInterrupt::operator()(shutdown);
    if (!bVar1) {
      logging_function._M_str = "AbortNode";
      logging_function._M_len = 9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/abort.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x18,ALL,Error,(ConstevalFormatString<0U>)0x6a6b6e);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AbortNode(util::SignalInterrupt* shutdown, std::atomic<int>& exit_status, const bilingual_str& message, node::Warnings* warnings)
{
    if (warnings) warnings->Set(Warning::FATAL_INTERNAL_ERROR, message);
    InitError(_("A fatal internal error occurred, see debug.log for details: ") + message);
    exit_status.store(EXIT_FAILURE);
    if (shutdown && !(*shutdown)()) {
        LogError("Failed to send shutdown signal\n");
    };
}